

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_image.h
# Opt level: O0

bool __thiscall
crnlib::image<crnlib::color_quad<unsigned_char,_int>_>::blit
          (image<crnlib::color_quad<unsigned_char,_int>_> *this,int dst_x,int dst_y,
          image<crnlib::color_quad<unsigned_char,_int>_> *src)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint src_w;
  uint src_h;
  bool success;
  uint height;
  uint width;
  int src_y;
  int src_x;
  image<crnlib::color_quad<unsigned_char,_int>_> *src_local;
  int dst_y_local;
  int dst_x_local;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_local;
  
  bVar1 = is_valid(this);
  if ((bVar1) && (bVar1 = is_valid(src), bVar1)) {
    width = 0;
    height = 0;
    src_local._4_4_ = dst_x;
    if (dst_x < 0) {
      width = -dst_x;
      uVar2 = get_width(src);
      if ((int)uVar2 <= (int)width) {
        return false;
      }
      src_local._4_4_ = 0;
    }
    src_local._0_4_ = dst_y;
    if (dst_y < 0) {
      height = -dst_y;
      uVar2 = get_height(src);
      if ((int)uVar2 <= (int)height) {
        return false;
      }
      src_local._0_4_ = 0;
    }
    if (((int)src_local._4_4_ < (int)this->m_width) && ((int)(uint)src_local < (int)this->m_height))
    {
      uVar2 = this->m_width;
      uVar3 = get_width(src);
      src_w = math::minimum<unsigned_int>(uVar2 - src_local._4_4_,uVar3 - width);
      uVar2 = this->m_height;
      uVar3 = get_height(src);
      src_h = math::minimum<unsigned_int>(uVar2 - (uint)src_local,uVar3 - height);
      unclipped_blit(this,width,height,src_w,src_h,src_local._4_4_,(uint)src_local,src);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool blit(int dst_x, int dst_y, const image& src)
        {
            if ((!is_valid()) || (!src.is_valid()))
            {
                CRNLIB_ASSERT(0);
                return false;
            }

            int src_x = 0;
            int src_y = 0;

            if (dst_x < 0)
            {
                src_x = -dst_x;
                if (src_x >= static_cast<int>(src.get_width()))
                {
                    return false;
                }
                dst_x = 0;
            }

            if (dst_y < 0)
            {
                src_y = -dst_y;
                if (src_y >= static_cast<int>(src.get_height()))
                {
                    return false;
                }
                dst_y = 0;
            }

            if ((dst_x >= (int)m_width) || (dst_y >= (int)m_height))
            {
                return false;
            }

            uint width = math::minimum(m_width - dst_x, src.get_width() - src_x);
            uint height = math::minimum(m_height - dst_y, src.get_height() - src_y);

            bool success = unclipped_blit(src_x, src_y, width, height, dst_x, dst_y, src);
            (void)success;
            CRNLIB_ASSERT(success);

            return true;
        }